

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O0

bool __thiscall MyServer::Initialize(MyServer *this)

{
  bool bVar1;
  long in_RDI;
  SDKJsonResult result;
  LogStringBuffer buffer;
  SDKJsonResult *in_stack_fffffffffffffc88;
  LogStringBuffer *in_stack_fffffffffffffc90;
  LogStringBuffer *buffer_00;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffcd4;
  string local_328 [48];
  undefined1 local_2f8 [64];
  char *local_2b8;
  Channel *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  Channel *local_290;
  undefined4 local_284;
  Channel *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  Channel *local_c8;
  string *local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  Channel *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  Channel *local_88;
  undefined8 local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  Channel *local_58;
  string *local_50;
  undefined1 *local_48;
  Channel *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  *(undefined4 *)(in_RDI + 0x24) = 0x285e;
  *(undefined4 *)(in_RDI + 0x28) = 10;
  *(undefined4 *)(in_RDI + 0x50) = 1000000000;
  buffer_00 = (LogStringBuffer *)local_2f8;
  tonk::SDKSocket::Create((SDKSocket *)buffer._40_8_);
  bVar1 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x106068);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcd0);
  if (bVar1) {
    local_2f8[0x37] = 1;
  }
  else {
    tonk::SDKJsonResult::ToString_abi_cxx11_(in_stack_fffffffffffffc88);
    local_2b0 = &Logger;
    local_2b8 = "Unable to create socket: ";
    local_2f8._56_8_ = local_328;
    local_290 = &Logger;
    local_294 = 4;
    local_2a0 = "Unable to create socket: ";
    local_280 = &Logger;
    local_284 = 4;
    local_2a8 = (string *)local_2f8._56_8_;
    if ((int)Logger.ChannelMinLevel < 5) {
      local_c8 = &Logger;
      local_cc = 4;
      local_d8 = "Unable to create socket: ";
      local_e0 = (string *)local_2f8._56_8_;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,Trace);
      local_b0 = 0x1182f8;
      local_a0 = &Logger;
      local_a8 = local_268;
      local_b8 = local_d8;
      local_c0 = local_e0;
      local_88 = &Logger;
      local_98 = local_b0;
      local_90 = local_a8;
      local_80 = local_b0;
      local_78 = local_a8;
      std::operator<<(aoStack_258,(string *)&Logger.Prefix);
      local_58 = &Logger;
      local_60 = local_a8;
      local_68 = local_b8;
      local_70 = local_c0;
      local_18 = &Logger;
      local_20 = local_a8;
      local_28 = local_b8;
      local_8 = local_a8;
      local_10 = local_b8;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_40 = &Logger;
      local_48 = local_60;
      local_50 = local_70;
      local_30 = local_60;
      local_38 = local_70;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)CONCAT44(in_stack_fffffffffffffcd4,uVar2),buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1063cf);
    }
    std::__cxx11::string::~string(local_328);
    local_2f8[0x37] = 0;
  }
  tonk::SDKJsonResult::~SDKJsonResult((SDKJsonResult *)0x10644c);
  return (bool)(local_2f8[0x37] & 1);
}

Assistant:

bool MyServer::Initialize()
{
    // Set configuration
    Config.UDPListenPort = kFileRendezvousServerPort;
    Config.MaximumClients = 10;
    //Config.EnableFEC = 0;
    //Config.InterfaceAddress = "127.0.0.1";
    Config.BandwidthLimitBPS = 1000 * 1000 * 1000;

    tonk::SDKJsonResult result = Create();
    if (!result) {
        Logger.Error("Unable to create socket: ", result.ToString());
        return false;
    }

    return true;
}